

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_AActor_SoundAlert
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *emitter;
  AActor *target;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  VMValue *pVVar4;
  undefined4 in_register_00000014;
  undefined8 uVar5;
  undefined8 extraout_RDX;
  TArray<VMValue,_VMValue> *pTVar6;
  char *pcVar7;
  bool bVar8;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  uVar5 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      emitter = (AActor *)(param->field_0).field_1.a;
      pTVar6 = defaultparam;
      if (emitter != (AActor *)0x0) {
        if ((emitter->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(emitter->super_DThinker).super_DObject._vptr_DObject)(emitter);
          (emitter->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
          uVar5 = extraout_RDX;
        }
        pPVar3 = (emitter->super_DThinker).super_DObject.Class;
        bVar8 = pPVar3 == (PClass *)0x0;
        ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),!bVar8);
        uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),bVar8);
        pTVar6 = (TArray<VMValue,_VMValue> *)
                 CONCAT71((int7)((ulong)pTVar6 >> 8),pPVar3 == pPVar1 || bVar8);
        if (pPVar3 != pPVar1 && !bVar8) {
          do {
            pPVar3 = pPVar3->ParentClass;
            ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),pPVar3 != (PClass *)0x0);
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003f17b8;
        }
      }
      pPVar1 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) {
        pcVar7 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          target = (AActor *)param[1].field_0.field_1.a;
          if (target != (AActor *)0x0) {
            if ((target->super_DThinker).super_DObject.Class == (PClass *)0x0) {
              iVar2 = (**(target->super_DThinker).super_DObject._vptr_DObject)
                                (target,pTVar6,uVar5,ret);
              (target->super_DThinker).super_DObject.Class =
                   (PClass *)CONCAT44(extraout_var_00,iVar2);
            }
            pPVar3 = (target->super_DThinker).super_DObject.Class;
            bVar8 = pPVar3 != (PClass *)0x0;
            if (pPVar3 != pPVar1 && bVar8) {
              do {
                pPVar3 = pPVar3->ParentClass;
                bVar8 = pPVar3 != (PClass *)0x0;
                if (pPVar3 == pPVar1) break;
              } while (pPVar3 != (PClass *)0x0);
            }
            if (!bVar8) {
              pcVar7 = "target == NULL || target->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_003f17d7;
            }
          }
          if (numparam < 3) {
            pVVar4 = defaultparam->Array;
            if (pVVar4[2].field_0.field_3.Type != '\0') {
              pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003f17f6;
            }
          }
          else {
            pVVar4 = param;
            if (param[2].field_0.field_3.Type != '\0') {
              pcVar7 = "(param[paramnum]).Type == REGT_INT";
LAB_003f17f6:
              __assert_fail(pcVar7,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                            ,0x10d,
                            "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 4) {
            param = defaultparam->Array;
            if (param[3].field_0.field_3.Type == '\x01') goto LAB_003f1765;
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
          }
          else {
            if (param[3].field_0.field_3.Type == '\x01') {
LAB_003f1765:
              P_NoiseAlert(target,emitter,pVVar4[2].field_0.i != 0,param[3].field_0.f);
              return 0;
            }
            pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
          }
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0x10e,
                        "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar7 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_003f17d7:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x10c,
                    "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003f17b8:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x10b,
                "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SoundAlert)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(target, AActor);
	PARAM_BOOL_DEF(splash);
	PARAM_FLOAT_DEF(maxdist);
	// Note that the emitter is self, not the target of the alert! Target can be NULL.
	P_NoiseAlert(target, self, splash, maxdist);
	return 0;
}